

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

int64_t __thiscall llvm::APInt::getSExtValue(APInt *this)

{
  uint uVar1;
  int64_t iVar2;
  
  if (this->BitWidth < 0x41) {
    iVar2 = SignExtend64((this->U).VAL,this->BitWidth);
    return iVar2;
  }
  uVar1 = getMinSignedBits(this);
  if (uVar1 < 0x41) {
    return *(this->U).pVal;
  }
  __assert_fail("getMinSignedBits() <= 64 && \"Too many bits for int64_t\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x623,"int64_t llvm::APInt::getSExtValue() const");
}

Assistant:

int64_t getSExtValue() const {
    if (isSingleWord())
      return SignExtend64(U.VAL, BitWidth);
    assert(getMinSignedBits() <= 64 && "Too many bits for int64_t");
    return int64_t(U.pVal[0]);
  }